

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall xatlas::internal::ArrayBase::insertAt(ArrayBase *this,uint32_t index,uint8_t *value)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  
  uVar3 = this->size;
  if (index <= uVar3) {
    uVar1 = uVar3 + 1;
    this->size = uVar1;
    if (this->capacity < uVar1) {
      uVar3 = uVar1 >> 2;
      if (this->capacity == 0) {
        uVar3 = 0;
      }
      setArrayCapacity(this,uVar3 + uVar1);
      uVar3 = this->size - 1;
    }
    if (index <= uVar3 && uVar3 - index != 0) {
      uVar2 = this->elementSize;
      memmove(this->buffer + (index + 1) * uVar2,this->buffer + uVar2 * index,
              (ulong)((uVar3 - index) * uVar2));
    }
    memcpy(this->buffer + index * this->elementSize,value,(ulong)this->elementSize);
    return;
  }
  __assert_fail("index >= 0 && index <= size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x430,"void xatlas::internal::ArrayBase::insertAt(uint32_t, const uint8_t *)");
}

Assistant:

void insertAt(uint32_t index, const uint8_t *value)
	{
		XA_DEBUG_ASSERT(index >= 0 && index <= size);
		resize(size + 1, false);
		if (index < size - 1)
			memmove(buffer + elementSize * (index + 1), buffer + elementSize * index, elementSize * (size - 1 - index));
		memcpy(&buffer[index * elementSize], value, elementSize);
	}